

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::Warp(Character *this,short map,uchar x,uchar y,WarpAnimation animation)

{
  World *pWVar1;
  bool bVar2;
  int num;
  size_type sVar3;
  Map *pMVar4;
  mapped_type *this_00;
  byte local_da;
  undefined1 local_b0 [8];
  PacketBuilder builder_1;
  key_type local_78;
  undefined1 local_48 [8];
  PacketBuilder builder;
  WarpAnimation animation_local;
  uchar y_local;
  uchar x_local;
  short map_local;
  Character *this_local;
  
  if (((0 < map) &&
      (builder.add_size._3_1_ = animation, builder.add_size._4_1_ = y, builder.add_size._5_1_ = x,
      builder.add_size._6_2_ = map,
      sVar3 = std::vector<Map_*,_std::allocator<Map_*>_>::size(&this->world->maps),
      (int)map <= (int)sVar3)) &&
     (pMVar4 = World::GetMap(this->world,builder.add_size._6_2_), (pMVar4->exists & 1U) != 0)) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_WARP,PACKET_REQUEST,0);
    if ((this->mapid == builder.add_size._6_2_) && ((this->nowhere & 1U) == 0)) {
      PacketBuilder::ReserveMore((PacketBuilder *)local_48,5);
      PacketBuilder::AddChar((PacketBuilder *)local_48,1);
      PacketBuilder::AddShort((PacketBuilder *)local_48,(int)builder.add_size._6_2_);
      PacketBuilder::AddChar((PacketBuilder *)local_48,(uint)builder.add_size._5_1_);
      PacketBuilder::AddChar((PacketBuilder *)local_48,(uint)builder.add_size._4_1_);
    }
    else {
      PacketBuilder::ReserveMore((PacketBuilder *)local_48,0xe);
      PacketBuilder::AddChar((PacketBuilder *)local_48,2);
      PacketBuilder::AddShort((PacketBuilder *)local_48,(int)builder.add_size._6_2_);
      pWVar1 = this->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"GlobalPK",(allocator<char> *)((long)&builder_1.add_size + 7));
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar1->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_78);
      bVar2 = util::variant::operator_cast_to_bool(this_00);
      local_da = 0;
      if (bVar2) {
        bVar2 = World::PKExcept(this->world,(int)builder.add_size._6_2_);
        local_da = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&builder_1.add_size + 7));
      if ((local_da & 1) == 0) {
        pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
        PacketBuilder::AddByte((PacketBuilder *)local_48,pMVar4->rid[0]);
        pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
        PacketBuilder::AddByte((PacketBuilder *)local_48,pMVar4->rid[1]);
      }
      else {
        PacketBuilder::AddByte((PacketBuilder *)local_48,0xff);
        PacketBuilder::AddByte((PacketBuilder *)local_48,'\x01');
      }
      pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
      PacketBuilder::AddByte((PacketBuilder *)local_48,pMVar4->rid[2]);
      pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
      PacketBuilder::AddByte((PacketBuilder *)local_48,pMVar4->rid[3]);
      pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
      PacketBuilder::AddThree((PacketBuilder *)local_48,pMVar4->filesize);
      PacketBuilder::AddChar((PacketBuilder *)local_48,0);
      PacketBuilder::AddChar((PacketBuilder *)local_48,0);
    }
    if ((this->map != (Map *)0x0) && ((this->map->exists & 1U) != 0)) {
      Map::Leave(this->map,this,builder.add_size._3_1_,false);
    }
    pMVar4 = World::GetMap(this->world,builder.add_size._6_2_);
    this->map = pMVar4;
    this->mapid = this->map->id;
    this->x = builder.add_size._5_1_;
    this->y = builder.add_size._4_1_;
    this->sitting = SIT_STAND;
    this->npc = (NPC *)0x0;
    this->npc_type = NPC;
    this->board = (Board *)0x0;
    this->jukebox_open = false;
    std::__cxx11::string::operator=((string *)&this->guild_join,"");
    std::__cxx11::string::operator=((string *)&this->guild_invite,"");
    if ((this->trading & 1U) != 0) {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_b0,PACKET_TRADE,PACKET_CLOSE,2);
      num = PlayerID(this);
      PacketBuilder::AddShort((PacketBuilder *)local_b0,num);
      Send(this->trade_partner,(PacketBuilder *)local_b0);
      this->trading = false;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                (&this->trade_inventory);
      this->trade_agree = false;
      this->trade_partner->trading = false;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                (&this->trade_partner->trade_inventory);
      this->trade_agree = false;
      CheckQuestRules(this);
      CheckQuestRules(this->trade_partner);
      this->trade_partner->trade_partner = (Character *)0x0;
      this->trade_partner = (Character *)0x0;
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_b0);
    }
    this->warp_anim = builder.add_size._3_1_;
    this->nowhere = false;
    Map::Enter(this->map,this,builder.add_size._3_1_);
    Send(this,(PacketBuilder *)local_48);
    if (this->arena != (Arena *)0x0) {
      this->arena->occupants = this->arena->occupants + -1;
      this->arena = (Arena *)0x0;
    }
    if (this->next_arena != (Arena *)0x0) {
      this->arena = this->next_arena;
      this->arena->occupants = this->arena->occupants + 1;
      this->next_arena = (Arena *)0x0;
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  }
  return;
}

Assistant:

void Character::Warp(short map, unsigned char x, unsigned char y, WarpAnimation animation)
{
	if (map <= 0 || map > int(this->world->maps.size()) || !this->world->GetMap(map)->exists)
	{
		return;
	}

	PacketBuilder builder(PACKET_WARP, PACKET_REQUEST);

	if (this->mapid == map && !this->nowhere)
	{
		builder.ReserveMore(5);
		builder.AddChar(WARP_LOCAL);
		builder.AddShort(map);
		builder.AddChar(x);
		builder.AddChar(y);
	}
	else
	{
		builder.ReserveMore(14);
		builder.AddChar(WARP_SWITCH);
		builder.AddShort(map);

		if (this->world->config["GlobalPK"] && !this->world->PKExcept(map))
		{
			builder.AddByte(0xFF);
			builder.AddByte(0x01);
		}
		else
		{
			builder.AddByte(this->world->GetMap(map)->rid[0]);
			builder.AddByte(this->world->GetMap(map)->rid[1]);
		}

		builder.AddByte(this->world->GetMap(map)->rid[2]);
		builder.AddByte(this->world->GetMap(map)->rid[3]);
		builder.AddThree(this->world->GetMap(map)->filesize);
		builder.AddChar(0); // ?
		builder.AddChar(0); // ?
	}

	if (this->map && this->map->exists)
	{
		this->map->Leave(this, animation);
	}

	this->map = this->world->GetMap(map);
	this->mapid = this->map->id;
	this->x = x;
	this->y = y;
	this->sitting = SIT_STAND;

	this->npc = 0;
	this->npc_type = ENF::NPC;
	this->board = 0;
	this->jukebox_open = false;
	this->guild_join = "";
	this->guild_invite = "";

	if (this->trading)
	{
		PacketBuilder builder(PACKET_TRADE, PACKET_CLOSE, 2);
		builder.AddShort(this->PlayerID());
		this->trade_partner->Send(builder);

		this->trading = false;
		this->trade_inventory.clear();
		this->trade_agree = false;

		this->trade_partner->trading = false;
		this->trade_partner->trade_inventory.clear();
		this->trade_agree = false;

		this->CheckQuestRules();
		this->trade_partner->CheckQuestRules();

		this->trade_partner->trade_partner = 0;
		this->trade_partner = 0;
	}

	this->warp_anim = animation;
	this->nowhere = false;

	this->map->Enter(this, animation);

	this->Send(builder);

	if (this->arena)
	{
		--this->arena->occupants;
		this->arena = 0;
	}

	if (this->next_arena)
	{
		this->arena = this->next_arena;
		++this->arena->occupants;
		this->next_arena = 0;
	}
}